

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O1

void __thiscall puppup::Game::ply(Game *this,Move m,bool fill_rack)

{
  long *plVar1;
  pointer pvVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  const_iterator __begin2;
  long *plVar6;
  long lVar7;
  array<long,_32UL> *container;
  long *plVar8;
  bool bVar9;
  
  if (this->winner_ == -1) {
    if (m.word != -1) {
      lVar5 = this->turn_;
      pvVar2 = (this->gaddag_->words_).
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar6 = *(long **)&pvVar2[m.word].super__Vector_base<long,_std::allocator<long>_>._M_impl;
      plVar3 = *(pointer *)
                ((long)&pvVar2[m.word].super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
      if (plVar6 != plVar3) {
        plVar8 = (long *)(m.cursor * 8 + ((ulong)((long)plVar3 - (long)plVar6) >> 3) * m.step * -8 +
                          0x20 + (long)this);
        do {
          if (*plVar8 == 0x1b) {
            lVar7 = *plVar6;
            *plVar8 = lVar7;
            plVar8[0x100] = (&scores)[lVar7];
            plVar1 = (this->racks_)._M_elems[lVar5]._M_elems + lVar7;
            *plVar1 = *plVar1 + -1;
          }
          plVar6 = plVar6 + 1;
          plVar8 = plVar8 + m.step;
        } while (plVar6 != plVar3);
      }
      if (m.blanks != 0) {
        do {
          (this->state_).letter_score._M_elems[(m.blanks & 0xffffU) - 1] = 0;
          plVar6 = (this->racks_)._M_elems[lVar5]._M_elems + 0x1a;
          *plVar6 = *plVar6 + -1;
          plVar6 = (this->racks_)._M_elems[lVar5]._M_elems +
                   (this->state_).board._M_elems[(m.blanks & 0xffffU) - 1];
          *plVar6 = *plVar6 + 1;
          bVar9 = 0xffff < (ulong)m.blanks;
          m.blanks = m.blanks >> 0x10;
        } while (bVar9);
      }
      lVar7 = 0;
      do {
        lVar4 = (this->racks_)._M_elems[lVar5]._M_elems[lVar7];
        if (lVar4 < 0) {
          plVar6 = (this->population_)._M_elems + lVar7;
          *plVar6 = *plVar6 + lVar4;
          (this->racks_)._M_elems[lVar5]._M_elems[lVar7] = 0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      (this->state_).score = (this->state_).score + m.score;
    }
    if (fill_rack) {
      container = (this->racks_)._M_elems + this->turn_;
      if (this->out_of_tiles_ == true) {
        lVar5 = 0;
        lVar7 = 0;
        do {
          lVar5 = lVar5 + *(long *)((long)container->_M_elems + lVar7);
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x100);
        if (lVar5 == 0) {
          checkWinner(this);
          return;
        }
      }
      else {
        fillRack<std::array<long,32ul>>(this,container);
      }
    }
    *(byte *)&this->turn_ = (byte)this->turn_ ^ 1;
    (this->state_).score = -(this->state_).score;
  }
  return;
}

Assistant:

void ply(movegen::Move m, const bool fill_rack = true) {
        if (winner_ != -1) {
            return;
        }
        movegen::makeMove(state_, racks_[turn_], population_, m, gaddag_);
        if (fill_rack) {
            if (!out_of_tiles_) {
                fillRack(racks_[turn_]);
            } else if (!std::accumulate(racks_[turn_].begin(),
                                        racks_[turn_].end(), idx(0))) {
                checkWinner();
                return;
            }
        }
        turn_ ^= 1;
        state_.score *= -1;
    }